

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O1

int op_insert(lua_State *L)

{
  uint8_t *__src;
  int iVar1;
  int *piVar2;
  lua_Integer lVar3;
  uint *puVar4;
  size_t sVar5;
  int iVar6;
  size_t __n;
  ulong uVar7;
  size_t sz;
  luaL_Buffer b;
  buffer local_20f0;
  char *local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  local_2058 = 0;
  local_2060 = luaL_checklstring(L,2,&local_2058);
  iVar1 = lua_isuserdata(L,3);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,3);
    if (iVar1 == 5) {
      sVar5 = lua_rawlen(L,3);
      if ((int)sVar5 < 1) {
        iVar1 = 0;
      }
      else {
        uVar7 = 1;
        iVar1 = 0;
        do {
          lua_rawgeti(L,3,uVar7);
          piVar2 = (int *)lua_touserdata(L,-1);
          if (piVar2 == (int *)0x0) {
            lua_settop(L,-2);
            iVar1 = luaL_error(L,"Invalid document at %d",uVar7 & 0xffffffff);
            break;
          }
          iVar1 = iVar1 + *piVar2;
          lua_settop(L,-2);
          uVar7 = uVar7 + 1;
        } while ((int)sVar5 + 1 != uVar7);
      }
    }
    else {
      iVar1 = luaL_error(L,"Insert need documents");
    }
  }
  else {
    piVar2 = (int *)lua_touserdata(L,3);
    iVar1 = *piVar2;
  }
  luaL_buffinit(L,&local_2050);
  __src = local_20f0.buffer;
  local_20f0.buffer[8] = '\0';
  local_20f0.buffer[9] = '\0';
  local_20f0.buffer[10] = '\0';
  local_20f0.buffer[0xb] = '\0';
  local_20f0.cap = 0x80;
  local_20f0.buffer[7] = '\0';
  local_20f0.buffer[5] = '\0';
  local_20f0.buffer[6] = '\0';
  local_20f0.buffer[4] = '\0';
  local_20f0.buffer[0xc] = 0xd2;
  local_20f0.buffer[0xd] = '\a';
  local_20f0.buffer[0xe] = '\0';
  local_20f0.size = 0x10;
  local_20f0.buffer[0xf] = '\0';
  local_20f0.ptr = __src;
  lVar3 = lua_tointegerx(L,1,(int *)0x0);
  __n = (size_t)local_20f0.size;
  if (local_20f0.cap < local_20f0.size + 4) {
    do {
      local_20f0.cap = local_20f0.cap * 2;
    } while (local_20f0.cap <= local_20f0.size + 4);
    if (local_20f0.ptr == __src) {
      local_20f0.ptr = (uint8_t *)malloc((long)local_20f0.cap);
      memcpy(local_20f0.ptr,__src,__n);
    }
    else {
      local_20f0.ptr = (uint8_t *)realloc(local_20f0.ptr,(long)local_20f0.cap);
    }
  }
  local_20f0.ptr[local_20f0.size] = (uint8_t)lVar3;
  local_20f0.ptr[local_20f0.size + 1] = (uint8_t)((ulong)lVar3 >> 8);
  iVar6 = local_20f0.size + 3;
  local_20f0.ptr[local_20f0.size + 2] = (uint8_t)((ulong)lVar3 >> 0x10);
  local_20f0.size = local_20f0.size + 4;
  local_20f0.ptr[iVar6] = (uint8_t)((ulong)lVar3 >> 0x18);
  write_string(&local_20f0,local_2060,local_2058);
  iVar1 = iVar1 + local_20f0.size;
  *local_20f0.ptr = (uint8_t)iVar1;
  local_20f0.ptr[1] = (uint8_t)((uint)iVar1 >> 8);
  local_20f0.ptr[2] = (uint8_t)((uint)iVar1 >> 0x10);
  local_20f0.ptr[3] = (uint8_t)((uint)iVar1 >> 0x18);
  luaL_addlstring(&local_2050,(char *)local_20f0.ptr,(long)local_20f0.size);
  if (local_20f0.ptr != __src) {
    free(local_20f0.ptr);
  }
  iVar1 = lua_isuserdata(L,3);
  if (iVar1 == 0) {
    sVar5 = lua_rawlen(L,3);
    if (0 < (int)sVar5) {
      uVar7 = 1;
      do {
        lua_rawgeti(L,3,uVar7);
        puVar4 = (uint *)lua_touserdata(L,-1);
        lua_settop(L,-2);
        luaL_addlstring(&local_2050,(char *)puVar4,(ulong)*puVar4);
        uVar7 = uVar7 + 1;
      } while ((int)sVar5 + 1 != uVar7);
    }
  }
  else {
    puVar4 = (uint *)lua_touserdata(L,3);
    luaL_addlstring(&local_2050,(char *)puVar4,(ulong)*puVar4);
  }
  luaL_pushresult(&local_2050);
  return 1;
}

Assistant:

static int
op_insert(lua_State *L) {
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int dsz = document_length(L);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_INSERT);
		write_int32(&buf, lua_tointeger(L,1));
		write_string(&buf, name, sz);

		int total = buf.size + dsz;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);
	
	if (lua_isuserdata(L,3)) {
		document doc = lua_touserdata(L,3);
		luaL_addlstring(&b, (const char *)doc, get_length(doc));
	} else {
		int s = lua_rawlen(L, 3);
		int i;
		for (i=1;i<=s;i++) {
			lua_rawgeti(L,3,i);
			document doc = lua_touserdata(L,-1);
			lua_pop(L,1);	// must call lua_pop before luaL_addlstring, because addlstring may change stack top
			luaL_addlstring(&b, (const char *)doc, get_length(doc));
		}
	}

	luaL_pushresult(&b);

	return 1;
}